

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFcntlExternalReader(unixFile *pFile,int *piOut)

{
  int iVar1;
  short local_48 [4];
  flock f;
  unixShmNode *pShmNode;
  int rc;
  int *piOut_local;
  unixFile *pFile_local;
  
  pShmNode._4_4_ = 0;
  *piOut = 0;
  if (pFile->pShm != (unixShm *)0x0) {
    f._24_8_ = pFile->pShm->pShmNode;
    memset(local_48,0,0x20);
    local_48[0] = 1;
    local_48[1] = 0;
    f.l_type = 0x7b;
    f.l_whence = 0;
    f._4_4_ = 0;
    f.l_start = 5;
    sqlite3_mutex_enter(*(sqlite3_mutex **)(f._24_8_ + 8));
    iVar1 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(f._24_8_ + 0x18),5,local_48);
    if (iVar1 < 0) {
      pShmNode._4_4_ = 0xf0a;
    }
    else {
      *piOut = (uint)(local_48[0] != 2);
    }
    sqlite3_mutex_leave(*(sqlite3_mutex **)(f._24_8_ + 8));
  }
  return pShmNode._4_4_;
}

Assistant:

static int unixFcntlExternalReader(unixFile *pFile, int *piOut){
  int rc = SQLITE_OK;
  *piOut = 0;
  if( pFile->pShm){
    unixShmNode *pShmNode = pFile->pShm->pShmNode;
    struct flock f;

    memset(&f, 0, sizeof(f));
    f.l_type = F_WRLCK;
    f.l_whence = SEEK_SET;
    f.l_start = UNIX_SHM_BASE + 3;
    f.l_len = SQLITE_SHM_NLOCK - 3;

    sqlite3_mutex_enter(pShmNode->pShmMutex);
    if( osFcntl(pShmNode->hShm, F_GETLK, &f)<0 ){
      rc = SQLITE_IOERR_LOCK;
    }else{
      *piOut = (f.l_type!=F_UNLCK);
    }
    sqlite3_mutex_leave(pShmNode->pShmMutex);
  }

  return rc;
}